

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O2

void joystick_callback(int jid,int event)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  
  if (event == 0x40001) {
    lVar2 = (long)joystick_count;
    joystick_count = joystick_count + 1;
    joysticks[lVar2] = jid;
  }
  else if (event == 0x40002) {
    uVar5 = 0;
    uVar3 = 0;
    if (0 < joystick_count) {
      uVar3 = (ulong)(uint)joystick_count;
    }
    for (piVar6 = joysticks; (uVar4 = uVar3, uVar3 != uVar5 && (uVar4 = uVar5, *piVar6 != jid));
        piVar6 = piVar6 + 1) {
      uVar5 = uVar5 + 1;
    }
    while (uVar3 = uVar4 + 1, (long)uVar3 < (long)joystick_count) {
      joysticks[uVar4] = joysticks[uVar3];
      uVar4 = uVar3;
    }
    joystick_count = joystick_count + -1;
  }
  iVar1 = glfwGetWindowAttrib(window,0x20001);
  if (iVar1 == 0) {
    glfwRequestWindowAttention(window);
    return;
  }
  return;
}

Assistant:

static void joystick_callback(int jid, int event)
{
    if (event == GLFW_CONNECTED)
        joysticks[joystick_count++] = jid;
    else if (event == GLFW_DISCONNECTED)
    {
        int i;

        for (i = 0;  i < joystick_count;  i++)
        {
            if (joysticks[i] == jid)
                break;
        }

        for (i = i + 1;  i < joystick_count;  i++)
            joysticks[i - 1] = joysticks[i];

        joystick_count--;
    }

    if (!glfwGetWindowAttrib(window, GLFW_FOCUSED))
        glfwRequestWindowAttention(window);
}